

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O3

uint32 Clasp::StatisticObject::registerMap<Clasp::JumpStats>(void)

{
  int iVar1;
  Map_T *local_10;
  
  if (registerMap<Clasp::JumpStats>()::vtab_s == '\0') {
    registerMap<Clasp::JumpStats>();
  }
  if (registerMap<Clasp::JumpStats>()::id == '\0') {
    iVar1 = __cxa_guard_acquire(&registerMap<Clasp::JumpStats>()::id);
    if (iVar1 != 0) {
      local_10 = &registerMap<Clasp::JumpStats>::vtab_s;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)types_s,(I **)&local_10);
      registerMap<Clasp::JumpStats>::id = types_s._8_4_ - 1;
      __cxa_guard_release(&registerMap<Clasp::JumpStats>()::id);
    }
  }
  return registerMap<Clasp::JumpStats>::id;
}

Assistant:

uint32 StatisticObject::registerMap() {
	static const struct Map_T : M {
		Map_T() : M(&Map_T::size, &Map_T::at, &Map_T::key) {}
		static inline const T* cast(ObjPtr obj) { return static_cast<const T*>(obj); }
		static uint32          size(ObjPtr obj) { return cast(obj)->size(); }
		static StatisticObject at(ObjPtr obj, const char* k) { return cast(obj)->at(k); }
		static const char*     key(ObjPtr obj, uint32 i) { return cast(obj)->key(i); }
	} vtab_s;
	static const uint32 id = registerType(&vtab_s);
	return id;
}